

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove3<(moira::Instr)71,(moira::Mode)4,(moira::Size)2>(Moira *this,u16 opcode)

{
  int *piVar1;
  bool bVar2;
  u32 uVar3;
  undefined8 in_RAX;
  bool bVar4;
  bool bVar5;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  uVar3 = computeEA<(moira::Mode)4,(moira::Size)2,0ul>(this,opcode & 7);
  uVar3 = readM<(moira::MemSpace)1,(moira::Size)2,64ul>(this,uVar3,&local_21);
  piVar1 = (int *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  *piVar1 = *piVar1 + -2;
  if (local_21 == false) {
    bVar4 = (bool)((byte)(uVar3 >> 0xf) & 1);
    (this->reg).sr.n = bVar4;
    bVar5 = (short)uVar3 == 0;
    (this->reg).sr.z = bVar5;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
    bVar2 = writeOp<(moira::Mode)3,(moira::Size)2,64ul>(this,opcode >> 9 & 7,uVar3);
    if (bVar2) {
      uVar3 = (this->reg).pc;
      (this->reg).pc0 = uVar3;
      (this->queue).ird = (this->queue).irc;
      uVar3 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar3 + 2);
      (this->queue).irc = (u16)uVar3;
      (this->reg).sr.n = bVar4;
      (this->reg).sr.z = bVar5;
      (this->reg).sr.v = false;
      (this->reg).sr.c = false;
    }
  }
  return;
}

Assistant:

void
Moira::execMove3(u16 opcode)
{
    u32 ea, data;

    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);

    if (!readOp <M, S, STD_AE_FRAME> (src, ea, data)) return;

    if (S == Word || (M != MODE_DN && M != MODE_AN && M != MODE_IM)) {
        reg.sr.n = NBIT<Word>(data);
        reg.sr.z = ZERO<Word>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }

    if (!writeOp <MODE_PI, S, AE_INC_PC> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}